

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_hpf1_init_preallocated(ma_hpf1_config *pConfig,void *pHeap,ma_hpf1 *pLPF)

{
  bool bVar1;
  ma_result mVar2;
  size_t __n;
  
  if (pLPF == (ma_hpf1 *)0x0) {
    mVar2 = MA_INVALID_ARGS;
  }
  else {
    pLPF->pR1 = (ma_biquad_coefficient *)0x0;
    pLPF->_pHeap = (void *)0x0;
    pLPF->format = ma_format_unknown;
    pLPF->channels = 0;
    *(undefined8 *)&pLPF->a = 0;
    *(undefined8 *)&pLPF->_ownsHeap = 0;
    mVar2 = MA_INVALID_ARGS;
    if ((pConfig == (ma_hpf1_config *)0x0) || ((ulong)pConfig->channels == 0)) {
      __n = 0;
      bVar1 = false;
    }
    else {
      __n = (ulong)pConfig->channels * 4 + 7 & 0xfffffffffffffff8;
      bVar1 = true;
      mVar2 = MA_SUCCESS;
    }
    if (bVar1) {
      pLPF->_pHeap = pHeap;
      if ((pHeap != (void *)0x0) && (__n != 0)) {
        memset(pHeap,0,__n);
      }
      pLPF->pR1 = (ma_biquad_coefficient *)pHeap;
      mVar2 = ma_hpf1_reinit(pConfig,pLPF);
      return mVar2;
    }
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_hpf1_init_preallocated(const ma_hpf1_config* pConfig, void* pHeap, ma_hpf1* pLPF)
{
    ma_result result;
    ma_hpf1_heap_layout heapLayout;

    if (pLPF == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pLPF);

    result = ma_hpf1_get_heap_layout(pConfig, &heapLayout);
    if (result != MA_SUCCESS) {
        return result;
    }

    pLPF->_pHeap = pHeap;
    MA_ZERO_MEMORY(pHeap, heapLayout.sizeInBytes);

    pLPF->pR1 = (ma_biquad_coefficient*)ma_offset_ptr(pHeap, heapLayout.r1Offset);

    return ma_hpf1_reinit(pConfig, pLPF);
}